

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fclose.c
# Opt level: O3

int fclose(FILE *__stream)

{
  char **mtx;
  int iVar1;
  uint uVar2;
  
  mtx_lock(&_PDCLIB_filelist_mtx);
  mtx = &__stream->_IO_save_base;
  mtx_lock((mtx_t *)mtx);
  if (((ulong)__stream->_IO_buf_end & 0x1000000000) == 0) {
LAB_001036ca:
    _PDCLIB_close(__stream->_flags);
    iVar1 = _PDCLIB_getstream((_PDCLIB_file_t *)__stream);
    if (iVar1 == 0) {
      uVar2 = *(uint *)((long)&__stream->_IO_buf_end + 4);
      if ((uVar2 >> 0xd & 1) != 0) {
        _PDCLIB_remove(*(char **)&__stream->_fileno);
        uVar2 = *(uint *)((long)&__stream->_IO_buf_end + 4);
      }
      if ((uVar2 >> 8 & 1) != 0) {
        free(__stream->_IO_read_ptr);
      }
      free(*(void **)&__stream->_fileno);
      mtx_unlock((mtx_t *)mtx);
      mtx_destroy((mtx_t *)mtx);
      iVar1 = 0;
      if ((((FILE *)stdin != __stream) && ((FILE *)stdout != __stream)) &&
         ((FILE *)stderr != __stream)) {
        free(__stream);
      }
      goto LAB_001036ea;
    }
  }
  else {
    iVar1 = _PDCLIB_flushbuffer((_PDCLIB_file_t *)__stream);
    if (iVar1 != -1) goto LAB_001036ca;
  }
  mtx_unlock((mtx_t *)mtx);
  iVar1 = -1;
LAB_001036ea:
  mtx_unlock(&_PDCLIB_filelist_mtx);
  return iVar1;
}

Assistant:

int fclose( struct _PDCLIB_file_t * stream )
{
    _PDCLIB_LOCK( _PDCLIB_filelist_mtx );
    _PDCLIB_LOCK( stream->mtx );

    /* Flush buffer */
    if ( stream->status & _PDCLIB_FWRITE )
    {
        if ( _PDCLIB_flushbuffer( stream ) == EOF )
        {
            /* Flush failed, errno already set */
            _PDCLIB_UNLOCK( stream->mtx );
            _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
            return EOF;
        }
    }

    /* Close handle */
    _PDCLIB_close( stream->handle );

    /* Remove stream from list */
    if ( _PDCLIB_getstream( stream ) )
    {
        _PDCLIB_UNLOCK( stream->mtx );
        _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );
        return EOF;
    }

    /* Delete tmpfile() */
    if ( stream->status & _PDCLIB_DELONCLOSE )
    {
        _PDCLIB_remove( stream->filename );
    }

    /* Free buffer */
    if ( stream->status & _PDCLIB_FREEBUFFER )
    {
        free( stream->buffer );
    }

    /* Free filename (standard streams do not have one, but free( NULL )
       is a valid no-op)
    */
    free( stream->filename );

    _PDCLIB_UNLOCK( stream->mtx );

#ifndef __STDC_NO_THREADS__
    mtx_destroy( &stream->mtx );
#endif

    /* Free stream */
    if ( stream != stdin && stream != stdout && stream != stderr )
    {
        free( stream );
    }

    _PDCLIB_UNLOCK( _PDCLIB_filelist_mtx );

    return 0;
}